

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Souperify.cpp
# Opt level: O0

vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> * __thiscall
wasm::DataFlow::UseFinder::getUses
          (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *__return_storage_ptr__,
          UseFinder *this,Expression *origin,Graph *graph,LocalGraph *localGraph)

{
  int iVar1;
  ostream *poVar2;
  LocalSet *set_00;
  LocalSet *set;
  LocalGraph *localGraph_local;
  Graph *graph_local;
  Expression *origin_local;
  UseFinder *this_local;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *ret;
  
  iVar1 = debug();
  if (1 < iVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"getUses\n");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,origin);
    std::operator<<(poVar2,'\n');
  }
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            (__return_storage_ptr__);
  set_00 = Graph::getSet(graph,origin);
  if (set_00 != (LocalSet *)0x0) {
    addSetUses(this,set_00,graph,localGraph,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Expression*>
  getUses(Expression* origin, Graph& graph, LocalGraph& localGraph) {
    if (debug() >= 2) {
      std::cout << "getUses\n" << origin << '\n';
    }
    std::vector<Expression*> ret;
    auto* set = graph.getSet(origin);
    if (!set) {
      // If the parent is not a set (a drop, call, return, etc.) then
      // it is not something we need to track.
      return ret;
    }
    addSetUses(set, graph, localGraph, ret);
    return ret;
  }